

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O2

Expression * __thiscall
wasm::TranslateToFuzzReader::makeTryTable(TranslateToFuzzReader *this,Type type)

{
  Random *this_00;
  char **this_01;
  Tag *pTVar1;
  Expression *target;
  optional<wasm::Type> type_00;
  optional<wasm::Type> type_01;
  byte bVar2;
  bool bVar3;
  Expression *body;
  value_type *pvVar4;
  value_type *ppEVar5;
  Type TVar6;
  TryTable *pTVar7;
  TranslateToFuzzReader *this_02;
  int iVar8;
  uint uVar9;
  Iterator __first;
  Iterator __last;
  _Storage<wasm::Type,_true> local_118;
  uint7 uStack_10f;
  _Storage<wasm::Type,_true> local_108;
  uint7 uStack_ff;
  undefined1 auStack_f8 [8];
  Name tagName;
  vector<wasm::Type,_std::allocator<wasm::Type>_> vec;
  Type tagTypeWithExn;
  Name dest;
  undefined1 auStack_a8 [8];
  vector<bool,_std::allocator<bool>_> catchRefs;
  undefined1 auStack_78 [8];
  vector<wasm::Name,_std::allocator<wasm::Name>_> catchDests;
  undefined1 auStack_58 [8];
  vector<wasm::Name,_std::allocator<wasm::Name>_> catchTags;
  Type local_38;
  
  body = make(this,type);
  if ((this->funcContext->breakableStack).
      super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
      super__Vector_impl_data._M_start ==
      (this->funcContext->breakableStack).
      super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    auStack_58 = (undefined1  [8])0x0;
    catchTags.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    catchTags.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    catchDests.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    auStack_78 = (undefined1  [8])0x0;
    catchDests.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    catchRefs.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_offset = 0;
    catchRefs.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._12_4_ = 0;
    catchRefs.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    auStack_a8 = (undefined1  [8])0x0;
    catchRefs.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    catchRefs.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_offset = 0;
    catchRefs.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._12_4_ = 0;
    type_01.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._8_8_ = (ulong)uStack_10f << 8;
    type_01.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._M_payload = local_118;
    pTVar7 = Builder::makeTryTable
                       (&this->builder,body,
                        (vector<wasm::Name,_std::allocator<wasm::Name>_> *)auStack_58,
                        (vector<wasm::Name,_std::allocator<wasm::Name>_> *)auStack_78,
                        (vector<bool,_std::allocator<bool>_> *)auStack_a8,type_01);
  }
  else {
    if ((this->wasm->tags).
        super__Vector_base<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        (this->wasm->tags).
        super__Vector_base<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>,_std::allocator<std::unique_ptr<wasm::Tag,_std::default_delete<wasm::Tag>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      addTag(this);
    }
    catchTags.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    catchDests.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    auStack_a8 = (undefined1  [8])0x0;
    catchRefs.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_p =
         (_Bit_type *)
         ((ulong)catchRefs.super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p._4_4_ << 0x20);
    catchRefs.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_offset = 0;
    catchRefs.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._12_4_ = 0;
    catchRefs.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_p =
         (_Bit_type *)
         ((ulong)catchRefs.super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p._4_4_ << 0x20);
    auStack_58 = (undefined1  [8])0x0;
    catchTags.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    catchRefs.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_offset = 0;
    catchRefs.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._12_4_ = 0;
    auStack_78 = (undefined1  [8])0x0;
    catchDests.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    this_00 = &this->random;
    catchTags.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ =
         Random::upTo(this_00,(this->fuzzParams->super_FuzzParams).MAX_TRY_CATCHES);
    for (uVar9 = 0;
        uVar9 <= catchTags.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage._4_4_; uVar9 = uVar9 + 1) {
      auStack_f8 = (undefined1  [8])0x0;
      tagName.super_IString.str._M_len = 0;
      local_38.id = 0;
      if (uVar9 < catchTags.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage._4_4_) {
        pvVar4 = Random::
                 pick<std::vector<std::unique_ptr<wasm::Tag,std::default_delete<wasm::Tag>>,std::allocator<std::unique_ptr<wasm::Tag,std::default_delete<wasm::Tag>>>>>
                           (this_00,&this->wasm->tags);
        pTVar1 = (pvVar4->_M_t).super___uniq_ptr_impl<wasm::Tag,_std::default_delete<wasm::Tag>_>.
                 _M_t.super__Tuple_impl<0UL,_wasm::Tag_*,_std::default_delete<wasm::Tag>_>.
                 super__Head_base<0UL,_wasm::Tag_*,_false>._M_head_impl;
        auStack_f8 = *(undefined1 (*) [8])&(pTVar1->super_Importable).super_Named;
        tagName.super_IString.str._M_len =
             *(size_t *)((long)&(pTVar1->super_Importable).super_Named + 8);
        local_38.id = ::wasm::HeapType::getSignature();
      }
      else {
        if (auStack_58 !=
            (undefined1  [8])
            catchTags.super__Vector_base<wasm::Name,_std::allocator<wasm::Name>_>._M_impl.
            super__Vector_impl_data._M_start) {
          bVar3 = Random::oneIn(this_00,2);
          if (bVar3) break;
        }
        local_38.id = 0;
      }
      __last = Type::end(&local_38);
      __first.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index = 0;
      __first.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent = &local_38
      ;
      std::vector<wasm::Type,std::allocator<wasm::Type>>::vector<wasm::Type::Iterator,void>
                ((vector<wasm::Type,std::allocator<wasm::Type>> *)&tagName.super_IString.str._M_str,
                 __first,__last,(allocator_type *)&tagTypeWithExn);
      Type::Type(&tagTypeWithExn,(HeapType)0x48,NonNullable,Inexact);
      this_01 = &tagName.super_IString.str._M_str;
      std::vector<wasm::Type,_std::allocator<wasm::Type>_>::emplace_back<wasm::Type>
                ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)this_01,&tagTypeWithExn);
      ::wasm::Type::Type((Type *)&vec.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage,
                         (vector *)this_01);
      for (iVar8 = (this->fuzzParams->super_FuzzParams).TRIES; 0 < iVar8; iVar8 = iVar8 + -1) {
        this_02 = (TranslateToFuzzReader *)this_00;
        ppEVar5 = Random::pick<std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>
                            (this_00,&this->funcContext->breakableStack);
        target = *ppEVar5;
        _tagTypeWithExn = (string_view)getTargetName(this_02,target);
        TVar6 = getTargetType(this_02,target);
        bVar2 = ::wasm::Type::isSubType(local_38,TVar6);
        bVar3 = (bool)::wasm::Type::isSubType
                                ((Type)vec.
                                       super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
                                       _M_impl.super__Vector_impl_data._M_end_of_storage,TVar6);
        if ((bVar2 | bVar3) == 1) {
          std::vector<wasm::Name,_std::allocator<wasm::Name>_>::push_back
                    ((vector<wasm::Name,_std::allocator<wasm::Name>_> *)auStack_58,
                     (value_type *)auStack_f8);
          std::vector<wasm::Name,_std::allocator<wasm::Name>_>::push_back
                    ((vector<wasm::Name,_std::allocator<wasm::Name>_> *)auStack_78,
                     (value_type *)&tagTypeWithExn);
          std::vector<bool,_std::allocator<bool>_>::push_back
                    ((vector<bool,_std::allocator<bool>_> *)auStack_a8,bVar3);
          break;
        }
      }
      std::_Vector_base<wasm::Type,_std::allocator<wasm::Type>_>::~_Vector_base
                ((_Vector_base<wasm::Type,_std::allocator<wasm::Type>_> *)
                 &tagName.super_IString.str._M_str);
    }
    type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._8_8_ = (ulong)uStack_ff << 8;
    type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._M_payload = local_108;
    pTVar7 = Builder::makeTryTable
                       (&this->builder,body,
                        (vector<wasm::Name,_std::allocator<wasm::Name>_> *)auStack_58,
                        (vector<wasm::Name,_std::allocator<wasm::Name>_> *)auStack_78,
                        (vector<bool,_std::allocator<bool>_> *)auStack_a8,type_00);
  }
  std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
            ((_Bvector_base<std::allocator<bool>_> *)auStack_a8);
  std::_Vector_base<wasm::Name,_std::allocator<wasm::Name>_>::~_Vector_base
            ((_Vector_base<wasm::Name,_std::allocator<wasm::Name>_> *)auStack_78);
  std::_Vector_base<wasm::Name,_std::allocator<wasm::Name>_>::~_Vector_base
            ((_Vector_base<wasm::Name,_std::allocator<wasm::Name>_> *)auStack_58);
  return (Expression *)pTVar7;
}

Assistant:

Expression* TranslateToFuzzReader::makeTryTable(Type type) {
  auto* body = make(type);

  if (funcContext->breakableStack.empty()) {
    // Nothing to break to, emit a trivial TryTable.
    // TODO: Perhaps generate a block wrapping us?
    return builder.makeTryTable(body, {}, {}, {});
  }

  if (wasm.tags.empty()) {
    addTag();
  }

  // Add catches of specific tags, and possibly a catch_all at the end. We use
  // the last iteration of the loop for that.
  std::vector<Name> catchTags;
  std::vector<Name> catchDests;
  std::vector<bool> catchRefs;
  auto numCatches = upTo(fuzzParams->MAX_TRY_CATCHES);
  for (Index i = 0; i <= numCatches; i++) {
    Name tagName;
    Type tagType;
    if (i < numCatches) {
      // Look for a specific tag.
      auto& tag = pick(wasm.tags);
      tagName = tag->name;
      tagType = tag->params();
    } else {
      // Add a catch_all at the end, some of the time (but all of the time if we
      // have nothing else).
      if (!catchTags.empty() && oneIn(2)) {
        break;
      }
      tagType = Type::none;
    }

    // We need to find a proper target to break to, which means a target that
    // has the type of the tag, or the tag + an exnref at the end.
    std::vector<Type> vec(tagType.begin(), tagType.end());
    // Use a non-nullable exnref here, and then the subtyping check below will
    // also accept a target that is nullable.
    vec.push_back(Type(HeapType::exn, NonNullable));
    auto tagTypeWithExn = Type(vec);
    int tries = fuzzParams->TRIES;
    while (tries-- > 0) {
      auto* target = pick(funcContext->breakableStack);
      auto dest = getTargetName(target);
      auto valueType = getTargetType(target);
      auto subOfTagType = Type::isSubType(tagType, valueType);
      auto subOfTagTypeWithExn = Type::isSubType(tagTypeWithExn, valueType);
      if (subOfTagType || subOfTagTypeWithExn) {
        catchTags.push_back(tagName);
        catchDests.push_back(dest);
        catchRefs.push_back(subOfTagTypeWithExn);
        break;
      }
    }
    // TODO: Perhaps generate a block wrapping us, if we fail to find a target?
    // TODO: It takes a bit of luck to find a target with an exnref - perhaps
    //       generate those?
  }

  return builder.makeTryTable(body, catchTags, catchDests, catchRefs);
}